

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrVec.h
# Opt level: O0

StrVec * __thiscall StrVec::operator=(StrVec *this,StrVec *rhs)

{
  ostream *this_00;
  string *b;
  string *e;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pVar1;
  string *local_28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  data;
  StrVec *rhs_local;
  StrVec *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"StrVec copy assignment.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  b = begin_abi_cxx11_(rhs);
  e = end_abi_cxx11_(rhs);
  pVar1 = alloc_n_copy(this,b,e);
  free(this,b);
  local_28 = pVar1.first;
  this->elements = local_28;
  data.first = pVar1.second;
  this->cap = data.first;
  this->first_free = data.first;
  return this;
}

Assistant:

inline
StrVec& StrVec::operator=(const StrVec& rhs)
{
	std::cout << "StrVec copy assignment." << std::endl;
	// call alloc_n_copy to allocate exactly as many elements as in rhs
	auto data = alloc_n_copy(rhs.begin(), rhs.end());
	free();
	elements = data.first;
	first_free = cap = data.second;
	return *this;
}